

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::~cmComputeLinkDepends(cmComputeLinkDepends *this)

{
  cmComputeComponentGraph *this_00;
  
  cmDeleteAll<std::vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>>
            (&this->InferredDependSets);
  this_00 = this->CCG;
  if (this_00 != (cmComputeComponentGraph *)0x0) {
    cmComputeComponentGraph::~cmComputeComponentGraph(this_00);
  }
  operator_delete(this_00,0xd8);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&(this->OldWrongConfigItems)._M_t);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::PendingComponent>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
  ::~_Rb_tree(&(this->PendingComponents)._M_t);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::
  _Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ::~_Vector_base(&(this->InferredDependSets).
                   super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
                 );
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->SharedDepFollowed)._M_t);
  std::
  deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
  ::~deque(&(this->SharedDepQueue).c);
  std::_Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
  ::~_Deque_base((_Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  *)&this->BFSQueue);
  std::
  _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_int>,_std::_Select1st<std::pair<const_cmLinkItem,_int>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_int>_>_>
  ::~_Rb_tree(&(this->LinkEntryIndex)._M_t);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->EntryList);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->FinalLinkEntries);
  std::__cxx11::string::~string((string *)&this->Config);
  return;
}

Assistant:

cmComputeLinkDepends::~cmComputeLinkDepends()
{
  cmDeleteAll(this->InferredDependSets);
  delete this->CCG;
}